

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeWindow.cpp
# Opt level: O3

void * __thiscall eglu::NativeWindow::getPlatformNative(NativeWindow *this)

{
  Capability CVar1;
  NotSupportedError *this_00;
  pointer_____offset_0x10___ *ppuVar2;
  
  CVar1 = this->m_capabilities;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((CVar1 & CAPABILITY_CREATE_SURFACE_PLATFORM) == 0) {
    tcu::NotSupportedError::NotSupportedError
              (this_00,"eglu::NativeWindow doesn\'t support eglCreatePlatformWindowSurface()",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
               ,0x2f);
    ppuVar2 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::InternalError::InternalError
              ((InternalError *)this_00,(char *)0x0,
               "(m_capabilities & CAPABILITY_CREATE_SURFACE_PLATFORM) == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
               ,0x2e);
    ppuVar2 = &tcu::InternalError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar2,tcu::Exception::~Exception);
}

Assistant:

void* NativeWindow::getPlatformNative (void)
{
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_CREATE_SURFACE_PLATFORM) == 0);
	throw tcu::NotSupportedError("eglu::NativeWindow doesn't support eglCreatePlatformWindowSurface()", DE_NULL, __FILE__, __LINE__);
}